

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

void Amap_ManMatch(Amap_Man_t *p,int fFlow,int fRefs)

{
  float fVar1;
  float fVar2;
  Aig_MmFlex_t *p_00;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Aig_MmFlex_t *pAVar6;
  Amap_Obj_t *pObj_00;
  abctime aVar7;
  float fVar8;
  float fVar9;
  abctime clk;
  int local_30;
  int nInvs;
  int i;
  float Area;
  Amap_Obj_t *pObj;
  Aig_MmFlex_t *pMemOld;
  int fRefs_local;
  int fFlow_local;
  Amap_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  p_00 = p->pMemCutBest;
  pAVar6 = Aig_MmFlexStart();
  p->pMemCutBest = pAVar6;
  for (local_30 = 0; iVar3 = Vec_PtrSize(p->vObjs), local_30 < iVar3; local_30 = local_30 + 1) {
    pObj_00 = (Amap_Obj_t *)Vec_PtrEntry(p->vObjs,local_30);
    if (((pObj_00 != (Amap_Obj_t *)0x0) && (iVar3 = Amap_ObjIsNode(pObj_00), iVar3 != 0)) &&
       ((pObj_00->field_11).pData != (void *)0x0)) {
      Amap_ManMatchNode(p,pObj_00,fFlow,fRefs);
    }
  }
  Aig_MmFlexStop(p_00,0);
  fVar8 = Amap_ManComputeMapping(p);
  uVar4 = Amap_ManCountInverters(p);
  if (p->pPars->fVerbose != 0) {
    fVar1 = p->fAreaInv;
    fVar2 = p->fAreaInv;
    fVar9 = Amap_ManMaxDelay(p);
    printf("Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ",
           (double)((float)(int)uVar4 * fVar1 + fVar8),(double)fVar8,
           (double)((float)(int)uVar4 * fVar2),(double)fVar9,(ulong)uVar4);
    Abc_Print(1,"%s =","Time ");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar5) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_ManMatch( Amap_Man_t * p, int fFlow, int fRefs )
{
    Aig_MmFlex_t * pMemOld;
    Amap_Obj_t * pObj;
    float Area;
    int i, nInvs;
    abctime clk = Abc_Clock();
    pMemOld = p->pMemCutBest;
    p->pMemCutBest = Aig_MmFlexStart();
    Amap_ManForEachNode( p, pObj, i )
        if ( pObj->pData )
            Amap_ManMatchNode( p, pObj, fFlow, fRefs );
    Aig_MmFlexStop( pMemOld, 0 );
    Area = Amap_ManComputeMapping( p );
    nInvs = Amap_ManCountInverters( p );
if ( p->pPars->fVerbose )
{
    printf( "Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ", 
        Area + nInvs * p->fAreaInv, 
        Area, nInvs * p->fAreaInv, nInvs,
        Amap_ManMaxDelay(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
}
    // test procedures
//    Amap_ManForEachNode( p, pObj, i )
//        Amap_CutAreaTest( p, pObj );
}